

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  long *plVar1;
  long *plVar2;
  ZoneHeap *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined8 *puVar6;
  void *pvVar7;
  sbyte sVar8;
  sbyte sVar9;
  long *plVar10;
  uint uVar11;
  long extraout_RDX;
  long extraout_RDX_00;
  Error EVar12;
  uint uVar13;
  ZoneBitVector *pZVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  size_t sStack_60;
  ZoneBitVector *pZStack_58;
  size_t sStack_30;
  
  if (to <= from) {
    return (uint)(to < from) + (uint)(to < from) * 2;
  }
  if (*(ulong *)(this + 8) < from) {
    fill();
LAB_00119a81:
    fill();
LAB_00119a86:
    fill();
  }
  else {
    if (*(ulong *)(this + 8) < to) goto LAB_00119a81;
    this = *(ZoneBitVector **)this;
    if (this == (ZoneBitVector *)0x0) goto LAB_00119a86;
    uVar5 = from >> 6;
    uVar13 = (uint)from & 0x3f;
    from = (size_t)uVar13;
    uVar15 = to >> 6;
    uVar11 = (uint)to & 0x3f;
    sVar8 = (sbyte)uVar11;
    if ((ZoneHeap *)from == (ZoneHeap *)0x0) {
LAB_00119994:
      auVar4 = _DAT_00135a50;
      auVar3 = _DAT_00135a40;
      lVar16 = uVar15 - uVar5;
      if (uVar5 <= uVar15 && lVar16 != 0) {
        lVar17 = lVar16 + -1;
        auVar19._8_4_ = (int)lVar17;
        auVar19._0_8_ = lVar17;
        auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
        uVar18 = 0;
        auVar19 = auVar19 ^ _DAT_00135a50;
        do {
          auVar20._8_4_ = (int)uVar18;
          auVar20._0_8_ = uVar18;
          auVar20._12_4_ = (int)(uVar18 >> 0x20);
          auVar20 = (auVar20 | auVar3) ^ auVar4;
          if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                      auVar19._4_4_ < auVar20._4_4_) & 1)) {
            *(ulong *)(this + uVar18 * 8 + uVar5 * 8) = -(ulong)value;
          }
          if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
              auVar20._12_4_ <= auVar19._12_4_) {
            *(ulong *)(this + uVar18 * 8 + uVar5 * 8 + 8) = -(ulong)value;
          }
          uVar18 = uVar18 + 2;
        } while ((lVar16 + 1U & 0xfffffffffffffffe) != uVar18);
      }
      if ((to & 0x3f) != 0) {
        uVar5 = -1L << sVar8;
        if (value) {
          *(ulong *)(this + uVar15 * 8) = *(ulong *)(this + uVar15 * 8) | ~uVar5;
        }
        else {
          *(ulong *)(this + uVar15 * 8) = *(ulong *)(this + uVar15 * 8) & uVar5;
        }
      }
      return 0;
    }
    sVar9 = (sbyte)uVar13;
    if (uVar5 != uVar15) {
      if (value) {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) | -1L << sVar9;
      }
      else {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) & ~(-1L << sVar9);
      }
      uVar5 = uVar5 + 1;
      goto LAB_00119994;
    }
    if (uVar13 < uVar11) {
      uVar15 = ~(-1L << (sVar8 - sVar9 & 0x3fU)) << sVar9;
      if (value) {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) | uVar15;
      }
      else {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) & ~uVar15;
      }
      return 0;
    }
  }
  fill();
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    if (*(long **)(this + 8) != (long *)0x0) {
      plVar10 = *(long **)(this + 8);
      if (*plVar1 == 0) {
        pZVar14 = this;
        ZoneStackBase::_init();
        this_00 = *(ZoneHeap **)pZVar14;
        pZStack_58 = this;
        if (this_00 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar5 = from & 0xffffffff;
          lVar16 = *(long *)(pZVar14 + uVar5 * 8 + 8);
          if (*(long *)(lVar16 + 0x10) != *(long *)(lVar16 + 0x18)) {
            if (this_00->_zone != (Zone *)0x0) {
              pvVar7 = ZoneHeap::_alloc(this_00,0x200,&sStack_60);
              if (pvVar7 == (void *)0x0) {
                return 1;
              }
              *(undefined8 *)((long)pvVar7 + uVar5 * 8) = 0;
              *(long *)((long)pvVar7 + (ulong)((int)from == 0) * 8) = lVar16;
              *(long *)((long)pvVar7 + 0x10) = extraout_RDX_00 + (long)pvVar7;
              *(long *)((long)pvVar7 + 0x18) = extraout_RDX_00 + (long)pvVar7;
              *(void **)(lVar16 + uVar5 * 8) = pvVar7;
              *(void **)(pZVar14 + uVar5 * 8 + 8) = pvVar7;
              return 0;
            }
            goto LAB_00119bc2;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119bc2:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      do {
        plVar2 = (long *)plVar10[1];
        *plVar10 = plVar1[10];
        plVar1[10] = (long)plVar10;
        plVar10 = plVar2;
      } while (plVar2 != (long *)0x0);
    }
    *(long *)this = 0;
    *(long *)(this + 8) = 0;
    *(long *)(this + 0x10) = 0;
  }
  EVar12 = 0;
  if ((ZoneHeap *)from != (ZoneHeap *)0x0) {
    if (((ZoneHeap *)from)->_zone == (Zone *)0x0) {
      ZoneStackBase::_init();
    }
    else {
      puVar6 = (undefined8 *)ZoneHeap::_alloc((ZoneHeap *)from,0x200,&sStack_30);
      if (puVar6 != (undefined8 *)0x0) {
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6[2] = extraout_RDX + (long)puVar6;
        puVar6[3] = extraout_RDX + (long)puVar6;
        *(size_t *)this = from;
        *(undefined8 **)(this + 8) = puVar6;
        *(undefined8 **)(this + 0x10) = puVar6;
        return 0;
      }
    }
    EVar12 = 1;
  }
  return EVar12;
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}